

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_block_allocator.cpp
# Opt level: O2

void __thiscall
foxxll::disk_block_allocator::deallocation_error
          (disk_block_allocator *this,uint64_t block_pos,uint64_t block_size,iterator *pred,
          iterator *succ)

{
  _Rb_tree_header *p_Var1;
  char *pcVar2;
  Logger LStack_1a8;
  
  tlx::Logger::Logger(&LStack_1a8);
  std::operator<<((ostream *)&LStack_1a8,"Error deallocating block at ");
  std::ostream::_M_insert<unsigned_long>((ulong)&LStack_1a8);
  std::operator<<((ostream *)&LStack_1a8," size ");
  std::ostream::_M_insert<unsigned_long>((ulong)&LStack_1a8);
  tlx::Logger::~Logger(&LStack_1a8);
  tlx::Logger::Logger(&LStack_1a8);
  pcVar2 = "pred!=succ";
  if (pred->_M_node == succ->_M_node) {
    pcVar2 = "pred==succ";
  }
  std::operator<<((ostream *)&LStack_1a8,pcVar2);
  tlx::Logger::~Logger(&LStack_1a8);
  p_Var1 = &(this->free_space_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)pred->_M_node == p_Var1) {
    tlx::Logger::Logger(&LStack_1a8);
    std::operator<<((ostream *)&LStack_1a8,"pred==free_space_.end()");
  }
  else {
    if (pred->_M_node == (this->free_space_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
      tlx::Logger::Logger(&LStack_1a8);
      std::operator<<((ostream *)&LStack_1a8,"pred==free_space_.begin()");
      tlx::Logger::~Logger(&LStack_1a8);
    }
    tlx::Logger::Logger(&LStack_1a8);
    std::operator<<((ostream *)&LStack_1a8,"pred: begin=");
    tlx::LoggerFormatter<unsigned_long,_void>::print
              ((ostream *)&LStack_1a8,(unsigned_long *)(pred->_M_node + 1));
    std::operator<<((ostream *)&LStack_1a8," size=");
    tlx::LoggerFormatter<unsigned_long,_void>::print
              ((ostream *)&LStack_1a8,(unsigned_long *)&pred->_M_node[1]._M_parent);
  }
  tlx::Logger::~Logger(&LStack_1a8);
  if ((_Rb_tree_header *)succ->_M_node == p_Var1) {
    tlx::Logger::Logger(&LStack_1a8);
    std::operator<<((ostream *)&LStack_1a8,"succ==free_space_.end()");
  }
  else {
    if (succ->_M_node == (this->free_space_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
      tlx::Logger::Logger(&LStack_1a8);
      std::operator<<((ostream *)&LStack_1a8,"succ==free_space_.begin()");
      tlx::Logger::~Logger(&LStack_1a8);
    }
    tlx::Logger::Logger(&LStack_1a8);
    std::operator<<((ostream *)&LStack_1a8,"succ: begin=");
    tlx::LoggerFormatter<unsigned_long,_void>::print
              ((ostream *)&LStack_1a8,(unsigned_long *)(succ->_M_node + 1));
    std::operator<<((ostream *)&LStack_1a8," size=");
    tlx::LoggerFormatter<unsigned_long,_void>::print
              ((ostream *)&LStack_1a8,(unsigned_long *)&succ->_M_node[1]._M_parent);
  }
  tlx::Logger::~Logger(&LStack_1a8);
  dump(this);
  return;
}

Assistant:

void disk_block_allocator::deallocation_error(
    uint64_t block_pos, uint64_t block_size,
    const space_map_type::iterator& pred,
    const space_map_type::iterator& succ) const
{
    TLX_LOG1 << "Error deallocating block at " << block_pos << " size " << block_size;
    TLX_LOG1 << ((pred == succ) ? "pred==succ" : "pred!=succ");
    if (pred == free_space_.end()) {
        TLX_LOG1 << "pred==free_space_.end()";
    }
    else {
        if (pred == free_space_.begin())
            TLX_LOG1 << "pred==free_space_.begin()";
        TLX_LOG1 << "pred: begin=" << pred->first << " size=" << pred->second;
    }
    if (succ == free_space_.end()) {
        TLX_LOG1 << "succ==free_space_.end()";
    }
    else {
        if (succ == free_space_.begin())
            TLX_LOG1 << "succ==free_space_.begin()";
        TLX_LOG1 << "succ: begin=" << succ->first << " size=" << succ->second;
    }
    dump();
}